

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O3

void gflags::ShowUsageWithFlagsMatching
               (char *argv0,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *substrings)

{
  string *filename;
  string *substrings_00;
  bool bVar1;
  bool *pbVar2;
  FILE *pFVar3;
  undefined1 *puVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  CommandLineFlagInfo *extraout_RDX;
  CommandLineFlagInfo *extraout_RDX_00;
  CommandLineFlagInfo *flag;
  bool bVar8;
  char *pcVar9;
  string *psVar10;
  string last_filename;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags;
  string local_a8;
  undefined1 *local_88;
  CommandLineFlagInfo *local_80;
  undefined1 local_78 [16];
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> local_68;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pFVar3 = _stdout;
  pcVar7 = strrchr(argv0,0x2f);
  pcVar9 = pcVar7 + 1;
  if (pcVar7 == (char *)0x0) {
    pcVar9 = argv0;
  }
  pcVar7 = ProgramUsage();
  fprintf(pFVar3,"%s: %s\n",pcVar9,pcVar7);
  local_68.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetAllFlags(&local_68);
  local_88 = local_78;
  local_80 = (CommandLineFlagInfo *)0x0;
  local_78[0] = 0;
  if (local_68.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
    bVar8 = false;
    psVar10 = &(local_68.
                super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                ._M_impl.super__Vector_impl_data._M_start)->filename;
    do {
      filename = (substrings->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      substrings_00 =
           (substrings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if ((filename == substrings_00) ||
         (bVar5 = FileMatchesSubstring
                            ((gflags *)(psVar10->_M_dataplus)._M_p,filename,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)substrings_00), bVar5)) {
        iVar6 = std::__cxx11::string::compare((char *)(psVar10 + -3));
        bVar8 = true;
        if (iVar6 != 0) {
          flag = (CommandLineFlagInfo *)psVar10->_M_string_length;
          if ((flag != local_80) ||
             ((flag != (CommandLineFlagInfo *)0x0 &&
              (iVar6 = bcmp((psVar10->_M_dataplus)._M_p,local_88,(size_t)flag), flag = extraout_RDX,
              iVar6 != 0)))) {
            std::__cxx11::string::rfind((char)psVar10,0x2f);
            std::__cxx11::string::substr((ulong)&local_a8,(ulong)psVar10);
            std::__cxx11::string::rfind((char)&local_88,0x2f);
            std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_88);
            puVar4 = local_50;
            if (local_a8._M_string_length == local_48) {
              if (local_a8._M_string_length == 0) {
                bVar5 = true;
              }
              else {
                iVar6 = bcmp(local_a8._M_dataplus._M_p,local_50,local_a8._M_string_length);
                bVar5 = iVar6 == 0;
              }
            }
            else {
              bVar5 = false;
            }
            if (puVar4 != local_40) {
              operator_delete(puVar4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if (bVar5 || bVar1) {
              bVar1 = (bool)(bVar5 & bVar1);
            }
            else {
              fwrite("\n\n",2,1,_stdout);
              bVar1 = false;
            }
            fprintf(_stdout,"\n  Flags from %s:\n",(psVar10->_M_dataplus)._M_p);
            std::__cxx11::string::_M_assign((string *)&local_88);
            flag = extraout_RDX_00;
          }
          pFVar3 = _stdout;
          DescribeOneFlag_abi_cxx11_(&local_a8,(gflags *)(psVar10 + -5),flag);
          fputs(local_a8._M_dataplus._M_p,pFVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
      }
      pbVar2 = (bool *)(psVar10 + 1);
      psVar10 = (string *)((long)(psVar10 + 6) + 0x10);
    } while ((pointer)((long)pbVar2 + 0x10) !=
             local_68.
             super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar8) goto LAB_00144ba3;
  }
  if ((substrings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (substrings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    fwrite("\n  No modules matched: use -help\n",0x21,1,_stdout);
  }
LAB_00144ba3:
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::~vector
            (&local_68);
  return;
}

Assistant:

static void ShowUsageWithFlagsMatching(const char *argv0,
                                       const vector<string> &substrings) {
  fprintf(stdout, "%s: %s\n", Basename(argv0), ProgramUsage());

  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);           // flags are sorted by filename, then flagname

  string last_filename;          // so we know when we're at a new file
  bool first_directory = true;   // controls blank lines between dirs
  bool found_match = false;      // stays false iff no dir matches restrict
  for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
       flag != flags.end();
       ++flag) {
    if (substrings.empty() ||
        FileMatchesSubstring(flag->filename, substrings)) {
      found_match = true;     // this flag passed the match!
      // If the flag has been stripped, pretend that it doesn't exist.
      if (flag->description == kStrippedFlagHelp) continue;
      if (flag->filename != last_filename) {                      // new file
        if (Dirname(flag->filename) != Dirname(last_filename)) {  // new dir!
          if (!first_directory)
            fprintf(stdout, "\n\n");   // put blank lines between directories
          first_directory = false;
        }
        fprintf(stdout, "\n  Flags from %s:\n", flag->filename.c_str());
        last_filename = flag->filename;
      }
      // Now print this flag
      fprintf(stdout, "%s", DescribeOneFlag(*flag).c_str());
    }
  }
  if (!found_match && !substrings.empty()) {
    fprintf(stdout, "\n  No modules matched: use -help\n");
  }
}